

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.cpp
# Opt level: O2

void calc<double>(string *Ja_in,string *Jb_in,string *Jc_in)

{
  long lVar1;
  ostream *poVar2;
  double Ja;
  double Jb;
  double Jc;
  double dVar3;
  
  Ja = convert<double>(Ja_in);
  Jb = convert<double>(Jb_in);
  Jc = convert<double>(Jc_in);
  dVar3 = ising::tc::triangular<double>(Ja,Jb,Jc);
  lVar1 = std::cout;
  *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xfffffefb |
       0x100;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 0xf;
  poVar2 = std::operator<<((ostream *)&std::cout,"# lattice: triangular\n");
  poVar2 = std::operator<<(poVar2,"# precision: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xf);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"# Ja Jb Jc Tc 1/Tc");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::ostream::_M_insert<double>(Ja);
  std::operator<<(poVar2,' ');
  poVar2 = std::ostream::_M_insert<double>(Jb);
  std::operator<<(poVar2,' ');
  poVar2 = std::ostream::_M_insert<double>(Jc);
  std::operator<<(poVar2,' ');
  poVar2 = std::ostream::_M_insert<double>(dVar3);
  std::operator<<(poVar2,' ');
  poVar2 = std::ostream::_M_insert<double>(1.0 / dVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void calc(const std::string& Ja_in, const std::string& Jb_in, const std::string& Jc_in) {
  typedef T real_t;
  real_t Ja = convert<real_t>(Ja_in);
  real_t Jb = convert<real_t>(Jb_in);
  real_t Jc = convert<real_t>(Jc_in);
  auto tc = ising::tc::triangular(Ja, Jb, Jc);
  std::cout << std::scientific << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: triangular\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10 << std::endl
            << "# Ja Jb Jc Tc 1/Tc" << std::endl
            << Ja << ' ' << Jb << ' ' << Jc << ' ' << tc << ' ' << (1 / tc) << std::endl;
}